

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::Cord::InlineRep::AppendTree
          (InlineRep *this,Nonnull<CordRep_*> tree,MethodIdentifier method)

{
  bool bVar1;
  MethodIdentifier method_local;
  Nonnull<CordRep_*> tree_local;
  InlineRep *this_local;
  
  if (tree == (Nonnull<CordRep_*>)0x0) {
    __assert_fail("tree != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                  ,0xe2,
                  "void absl::Cord::InlineRep::AppendTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                 );
  }
  if (tree->length != 0) {
    bVar1 = cord_internal::CordRep::IsCrc(tree);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!tree->IsCrc()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                    ,0xe4,
                    "void absl::Cord::InlineRep::AppendTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                   );
    }
    bVar1 = cord_internal::InlineData::is_tree(&this->data_);
    if (bVar1) {
      AppendTreeToTree(this,tree,method);
    }
    else {
      AppendTreeToInlined(this,tree,method);
    }
    return;
  }
  __assert_fail("tree->length != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                ,0xe3,
                "void absl::Cord::InlineRep::AppendTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
               );
}

Assistant:

void Cord::InlineRep::AppendTree(absl::Nonnull<CordRep*> tree,
                                 MethodIdentifier method) {
  assert(tree != nullptr);
  assert(tree->length != 0);
  assert(!tree->IsCrc());
  if (data_.is_tree()) {
    AppendTreeToTree(tree, method);
  } else {
    AppendTreeToInlined(tree, method);
  }
}